

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O0

void __thiscall Simulator::read_real_array(Simulator *this,PCode *code)

{
  Symbol *pSVar1;
  int iVar2;
  string *psVar3;
  vector<double,_std::allocator<double>_> *__x;
  reference pvVar4;
  undefined1 local_40 [8];
  vector<double,_std::allocator<double>_> array;
  Symbol *symbol;
  double input;
  PCode *code_local;
  Simulator *this_local;
  
  symbol = (Symbol *)0x0;
  input = (double)code;
  code_local = (PCode *)this;
  psVar3 = PCode::first_abi_cxx11_(code);
  array.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)ScopeTree::resolve(&this->tree_,psVar3);
  std::istream::operator>>((istream *)&std::cin,(double *)&symbol);
  __x = Symbol::real_array((Symbol *)
                           array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_40,__x);
  pSVar1 = symbol;
  psVar3 = PCode::second_abi_cxx11_((PCode *)input);
  iVar2 = get_second_parameter(this,psVar3);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_40,(long)iVar2);
  *pvVar4 = (value_type)pSVar1;
  Symbol::set_value((Symbol *)
                    array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (vector<double,_std::allocator<double>_> *)local_40);
  Symbol::set_assigned
            ((Symbol *)
             array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  inc_eip(this);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_40);
  return;
}

Assistant:

void Simulator::read_real_array(const PCode &code) {
    double input = 0;
    Symbol &symbol = tree_.resolve(code.first());

    std::cin >> input;
    std::vector<double> array = symbol.real_array();
    array[get_second_parameter(code.second())] = input;
    symbol.set_value(array);
    symbol.set_assigned();

    inc_eip();
}